

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O3

int64_t GetVirtualTransactionSize(CTransaction *tx,int64_t nSigOpCost,uint bytes_per_sigop)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  SizeComputer local_50;
  ParamsStream<SizeComputer_&,_TransactionSerParams> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.nSize = 0;
  local_48.m_params = &TX_NO_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,&local_48,&TX_NO_WITNESS);
  iVar1 = (int)local_50.nSize * 3;
  local_50.nSize = 0;
  local_48.m_params = &TX_WITH_WITNESS;
  local_48.m_substream = &local_50;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx,&local_48,&TX_WITH_WITNESS);
  lVar3 = (long)(iVar1 + (int)local_50.nSize);
  lVar2 = (ulong)bytes_per_sigop * nSigOpCost;
  if (lVar2 - lVar3 == 0 || lVar2 < lVar3) {
    lVar2 = lVar3;
  }
  lVar3 = lVar2 + 6;
  if (-1 < lVar2 + 3) {
    lVar3 = lVar2 + 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar3 >> 2;
  }
  __stack_chk_fail();
}

Assistant:

int64_t GetVirtualTransactionSize(const CTransaction& tx, int64_t nSigOpCost, unsigned int bytes_per_sigop)
{
    return GetVirtualTransactionSize(GetTransactionWeight(tx), nSigOpCost, bytes_per_sigop);
}